

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O0

void testOpenDeep(string *tempdir)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  ostream *poVar4;
  string *in_RDI;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exception *e;
  DeepScanLineInputFile file;
  int cp;
  int c;
  Compression comps [3];
  int chancounts [4];
  exr_context_initializer_t cinit;
  exr_context_t f;
  string fn;
  Compression in_stack_00000528;
  int in_stack_0000052c;
  string *in_stack_00000530;
  Compression in_stack_00000598;
  int in_stack_0000059c;
  string *in_stack_000005a0;
  ostream *in_stack_fffffffffffffe88;
  DeepScanLineInputFile *in_stack_fffffffffffffe90;
  ostream *in_stack_fffffffffffffe98;
  ostream *in_stack_fffffffffffffea0;
  DeepScanLineInputFile local_f0 [36];
  int local_cc;
  int local_c8;
  undefined8 local_c4;
  undefined4 local_bc;
  int local_b8 [8];
  undefined8 local_98;
  code *pcStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,in_RDI);
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_38 = 0;
  local_98 = 0x68;
  uStack_40 = 0xbf800000fffffffe;
  pcStack_90 = anon_unknown.dwarf_2effe::err_cb;
  std::__cxx11::string::operator+=(local_28,"randomtempdeep.exr");
  local_b8[0] = 1;
  local_b8[1] = 3;
  local_b8[2] = 10;
  local_b8[3] = 0;
  local_c4 = 0x100000000;
  local_bc = 2;
  for (local_c8 = 0; 0 < local_b8[local_c8]; local_c8 = local_c8 + 1) {
    for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
      anon_unknown.dwarf_2effe::generateRandomScanFile
                (in_stack_00000530,in_stack_0000052c,in_stack_00000528);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile(local_f0,pcVar2,8);
      Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile(in_stack_fffffffffffffe90);
      uVar3 = std::__cxx11::string::c_str();
      iVar1 = exr_start_read(local_30,uVar3,&local_98);
      if (iVar1 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
        poVar4 = std::operator<<(poVar4,") ");
        pcVar2 = (char *)exr_get_default_error_message(iVar1);
        poVar4 = std::operator<<(poVar4,pcVar2);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
                       (uint)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                       (char *)in_stack_fffffffffffffe88);
      }
      exr_finish(local_30);
      anon_unknown.dwarf_2effe::generateRandomTileFile
                (in_stack_000005a0,in_stack_0000059c,in_stack_00000598);
      uVar3 = std::__cxx11::string::c_str();
      iVar1 = exr_start_read(local_30,uVar3,&local_98);
      if (iVar1 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        in_stack_fffffffffffffea0 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
        in_stack_fffffffffffffe98 = std::operator<<(in_stack_fffffffffffffea0,") ");
        in_stack_fffffffffffffe90 = (DeepScanLineInputFile *)exr_get_default_error_message(iVar1);
        in_stack_fffffffffffffe88 =
             std::operator<<(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
        std::ostream::operator<<(in_stack_fffffffffffffe88,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
                       (uint)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                       (char *)in_stack_fffffffffffffe88);
      }
      exr_finish(local_30);
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void
testOpenDeep (const std::string& tempdir)
{
    std::string fn = tempdir;

    exr_context_t             f;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "randomtempdeep.exr";

    int         chancounts[] = {1, 3, 10, 0};
    Compression comps[] = {NO_COMPRESSION, RLE_COMPRESSION, ZIPS_COMPRESSION};
    for (int c = 0; chancounts[c] > 0; ++c)
    {
        for (int cp = 0; cp < 3; ++cp)
        {
            generateRandomScanFile (fn, chancounts[c], comps[cp]);
            try
            {
                DeepScanLineInputFile file (fn.c_str (), 8);
            }
            catch (std::exception& e)
            {
                std::cerr << "ERROR: c++ unable to open generated deep scane"
                          << e.what () << std::endl;
            }

            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
            exr_finish (&f);
            generateRandomTileFile (fn, chancounts[c], comps[cp]);
            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
            exr_finish (&f);
        }
    }
    remove (fn.c_str ());
}